

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamRandomAccessController::AdjustRegion
          (BamRandomAccessController *this,int *referenceCount)

{
  bool bVar1;
  byte bVar2;
  int *in_RSI;
  long *in_RDI;
  int rightBoundRefId;
  int currentId;
  int local_24;
  int local_14;
  int *local_10;
  
  if (*in_RDI != 0) {
    *(undefined1 *)(in_RDI + 3) = 0;
    local_14 = (int)in_RDI[1];
    local_10 = in_RSI;
    bVar1 = BamRegion::isRightBoundSpecified((BamRegion *)(in_RDI + 1));
    if (bVar1) {
      local_24 = (int)in_RDI[2];
    }
    else {
      local_24 = *local_10 + -1;
    }
    for (; local_14 <= local_24; local_14 = local_14 + 1) {
      bVar2 = (**(code **)(*(long *)*in_RDI + 0x18))((long *)*in_RDI,&local_14);
      *(byte *)(in_RDI + 3) = bVar2 & 1;
      if ((*(byte *)(in_RDI + 3) & 1) != 0) break;
    }
    if (((*(byte *)(in_RDI + 3) & 1) != 0) && (local_14 != (int)in_RDI[1])) {
      *(int *)(in_RDI + 1) = local_14;
      *(undefined4 *)((long)in_RDI + 0xc) = 0;
    }
  }
  return;
}

Assistant:

void BamRandomAccessController::AdjustRegion(const int& referenceCount)
{

    // skip if no index available
    if (m_index == 0) return;

    // see if any references in region have alignments
    m_hasAlignmentsInRegion = false;
    int currentId = m_region.LeftRefID;
    const int rightBoundRefId =
        (m_region.isRightBoundSpecified() ? m_region.RightRefID : referenceCount - 1);
    while (currentId <= rightBoundRefId) {
        m_hasAlignmentsInRegion = m_index->HasAlignments(currentId);
        if (m_hasAlignmentsInRegion) break;
        ++currentId;
    }

    // if no data found on any reference in region
    if (!m_hasAlignmentsInRegion) return;

    // if left bound of desired region had no data, use first reference that had data
    // otherwise, leave requested region as-is
    if (currentId != m_region.LeftRefID) {
        m_region.LeftRefID = currentId;
        m_region.LeftPosition = 0;
    }
}